

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

bool match_place_holder(Am_Value *placeholder_value,Am_Value *current_value)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Value *value;
  undefined1 local_40 [7];
  bool match;
  Am_Placeholder_Replace_Method method;
  Am_Object local_20;
  Am_Object placeholder;
  Am_Value *current_value_local;
  Am_Value *placeholder_value_local;
  
  placeholder.data = (Am_Object_Data *)current_value;
  Am_Object::Am_Object(&local_20,placeholder_value);
  poVar3 = std::operator<<((ostream *)&std::cout,"  Matching placeholder ");
  poVar3 = operator<<(poVar3,&local_20);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  value = Am_Object::Get(&local_20,Am_PLACEHOLDER_MATCH_METHOD,0);
  Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
            ((Am_Placeholder_Replace_Method *)local_40,value);
  bVar1 = Am_Placeholder_Replace_Method::Valid((Am_Placeholder_Replace_Method *)local_40);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"Placeholder ");
    poVar3 = operator<<(poVar3,&local_20);
    poVar3 = std::operator<<(poVar3," has no match method.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  bVar2 = (*(code *)method.from_wrapper)(&local_20,placeholder.data,&Am_No_Object);
  poVar3 = std::operator<<((ostream *)&std::cout,"  method ");
  poVar3 = operator<<(poVar3,(Am_Placeholder_Replace_Method *)local_40);
  poVar3 = std::operator<<(poVar3," returned ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(bool)(bVar2 & 1));
  pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  Am_Object::~Am_Object(&local_20);
  return (bool)(bVar2 & 1);
}

Assistant:

bool
match_place_holder(Am_Value &placeholder_value, Am_Value &current_value)
{
  Am_Object placeholder = placeholder_value;
  std::cout << "  Matching placeholder " << placeholder << std::endl
            << std::flush;
  Am_Placeholder_Replace_Method method =
      placeholder.Get(Am_PLACEHOLDER_MATCH_METHOD);
  if (!method.Valid())
    Am_ERROR("Placeholder " << placeholder << " has no match method.");
  bool match = method.Call(placeholder, current_value, Am_No_Object);
  std::cout << "  method " << method << " returned " << match << std::endl
            << std::flush;
  return match;
}